

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.hpp
# Opt level: O2

pair<double,_unsigned_long> compute_entropy(uint32_t *input,size_t n)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  size_type sVar3;
  mapped_type *pmVar4;
  size_t i;
  size_t sVar5;
  __node_base *p_Var6;
  undefined1 auVar7 [64];
  undefined1 in_ZMM1 [64];
  undefined1 in_XMM2 [16];
  pair<double,_unsigned_long> pVar8;
  uint32_t num;
  unordered_map<unsigned_int,_unsigned_long,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_long>_>_>
  freqs;
  uint32_t local_8c;
  undefined1 local_88 [16];
  double local_78;
  double local_70;
  _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_unsigned_long>,_std::allocator<std::pair<const_unsigned_int,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  local_68;
  undefined1 extraout_var [56];
  
  local_68._M_buckets = &local_68._M_single_bucket;
  p_Var6 = &local_68._M_before_begin;
  local_68._M_bucket_count = 1;
  local_68._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  local_68._M_element_count = 0;
  local_68._M_rehash_policy._M_max_load_factor = 1.0;
  local_68._M_rehash_policy._M_next_resize = 0;
  local_68._M_single_bucket = (__node_base_ptr)0x0;
  for (sVar5 = 0; n != sVar5; sVar5 = sVar5 + 1) {
    local_8c = input[sVar5];
    pmVar4 = std::__detail::
             _Map_base<unsigned_int,_std::pair<const_unsigned_int,_unsigned_long>,_std::allocator<std::pair<const_unsigned_int,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
             ::operator[]((_Map_base<unsigned_int,_std::pair<const_unsigned_int,_unsigned_long>,_std::allocator<std::pair<const_unsigned_int,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                           *)&local_68,&local_8c);
    *pmVar4 = *pmVar4 + 1;
  }
  auVar2 = vcvtusi2sd_avx512f(in_ZMM1._0_16_,n);
  local_78 = auVar2._0_8_;
  local_88 = ZEXT816(0) << 0x40;
  while (sVar3 = local_68._M_element_count, p_Var6 = p_Var6->_M_nxt, p_Var6 != (__node_base *)0x0) {
    auVar2 = vcvtusi2sd_avx512f(in_XMM2,*(_Hash_node_base **)
                                         &((_Prime_rehash_policy *)(p_Var6 + 2))->_M_max_load_factor
                               );
    local_70 = auVar2._0_8_ / local_78;
    auVar7._0_8_ = log2(local_70);
    auVar7._8_56_ = extraout_var;
    auVar1._8_8_ = 0;
    auVar1._0_8_ = local_70;
    local_88 = vfmadd231sd_fma(local_88,auVar7._0_16_,auVar1);
  }
  auVar2._8_8_ = 0x8000000000000000;
  auVar2._0_8_ = 0x8000000000000000;
  local_88 = vxorpd_avx512vl(local_88,auVar2);
  std::
  _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_unsigned_long>,_std::allocator<std::pair<const_unsigned_int,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::~_Hashtable(&local_68);
  pVar8.second = sVar3;
  pVar8.first = (double)local_88._0_8_;
  return pVar8;
}

Assistant:

std::pair<double, size_t> compute_entropy(const uint32_t* input, size_t n)
{
    std::unordered_map<uint32_t, uint64_t> freqs;
    for (size_t i = 0; i < n; i++) {
        uint32_t num = input[i];
        freqs[num] += 1;
    }
    double H0 = 0.0;
    double nn = n;
    for (const auto& c : freqs) {
        double p = double(c.second) / nn;
        H0 += (p * log2(p));
    }
    return { -H0, freqs.size() };
}